

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::GetKeyChordName(ImGuiKeyChord key_chord,char *out_buf,int out_buf_size)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int in_EDX;
  char *in_RSI;
  uint in_EDI;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffff98;
  char *local_50;
  
  pcVar1 = "";
  if ((in_EDI & 0x1000) != 0) {
    pcVar1 = "Ctrl+";
  }
  pcVar2 = "";
  if ((in_EDI & 0x2000) != 0) {
    pcVar2 = "Shift+";
  }
  pcVar3 = "";
  if ((in_EDI & 0x4000) != 0) {
    pcVar3 = "Alt+";
  }
  if ((in_EDI & 0x8000) == 0) {
    local_50 = "";
  }
  else {
    local_50 = "Super+";
    if (((GImGui->IO).ConfigMacOSXBehaviors & 1U) != 0) {
      local_50 = "Cmd+";
    }
  }
  pcVar4 = GetKeyName((ImGuiKey)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  ImFormatString(in_RSI,(long)in_EDX,"%s%s%s%s%s",pcVar1,pcVar2,pcVar3,local_50,pcVar4);
  return;
}

Assistant:

void ImGui::GetKeyChordName(ImGuiKeyChord key_chord, char* out_buf, int out_buf_size)
{
    ImGuiContext& g = *GImGui;
    ImFormatString(out_buf, (size_t)out_buf_size, "%s%s%s%s%s",
        (key_chord & ImGuiMod_Ctrl) ? "Ctrl+" : "",
        (key_chord & ImGuiMod_Shift) ? "Shift+" : "",
        (key_chord & ImGuiMod_Alt) ? "Alt+" : "",
        (key_chord & ImGuiMod_Super) ? (g.IO.ConfigMacOSXBehaviors ? "Cmd+" : "Super+") : "",
        GetKeyName((ImGuiKey)(key_chord & ~ImGuiMod_Mask_)));
}